

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::list_caster<std::vector<int,std::allocator<int>>,int>::
       cast<std::vector<int,std::allocator<int>>>
                 (vector<int,_std::allocator<int>_> *src,return_value_policy policy,handle parent)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  PyObject *tmp;
  handle hVar4;
  long lVar5;
  list l;
  object value_;
  handle local_30;
  object local_28;
  
  list::list((list *)&local_30,
             (long)(src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar1 = (src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar1 != piVar2) {
    lVar5 = 0;
    do {
      hVar4.m_ptr = (PyObject *)PyLong_FromSsize_t((long)*(int *)((long)piVar1 + lVar5));
      if (hVar4.m_ptr == (PyObject *)0x0) {
        local_28.super_handle.m_ptr = (handle)(handle)hVar4.m_ptr;
        object::~object(&local_28);
        hVar4.m_ptr = (PyObject *)0x0;
        goto LAB_0011afa0;
      }
      local_28.super_handle.m_ptr = (handle)(PyObject *)0x0;
      if (((local_30.m_ptr)->ob_type->tp_flags & 0x2000000) == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<int>, int>::cast(T &&, return_value_policy, handle) [Type = std::vector<int>, Value = int, T = std::vector<int>]"
                     );
      }
      *(PyObject **)((long)&((local_30.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar5 * 2) =
           hVar4.m_ptr;
      object::~object(&local_28);
      lVar3 = lVar5 + 4;
      lVar5 = lVar5 + 4;
    } while ((pointer)((long)piVar1 + lVar3) != piVar2);
  }
  hVar4.m_ptr = local_30.m_ptr;
  local_30.m_ptr = (PyObject *)0x0;
LAB_0011afa0:
  object::~object((object *)&local_30);
  return (handle)hVar4.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }